

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O1

parse_status_t parser_append(http_parser_t *parser,char *buf,size_t buf_length)

{
  int iVar1;
  parse_status_t pVar2;
  
  if (parser == (http_parser_t *)0x0) {
    __assert_fail("parser != NULL",".upnp/src/genlib/net/http/httpparser.c",0x83e,
                  "parse_status_t parser_append(http_parser_t *, const char *, size_t)");
  }
  if (buf != (char *)0x0) {
    iVar1 = membuffer_append(&(parser->msg).msg,buf,buf_length);
    if (iVar1 != 0) {
      parser->http_error_code = 500;
      return PARSE_FAILURE;
    }
    pVar2 = parser_parse(parser);
    return pVar2;
  }
  __assert_fail("buf != NULL",".upnp/src/genlib/net/http/httpparser.c",0x83f,
                "parse_status_t parser_append(http_parser_t *, const char *, size_t)");
}

Assistant:

parse_status_t parser_append(
	http_parser_t *parser, const char *buf, size_t buf_length)
{
	int ret_code;

	assert(parser != NULL);
	assert(buf != NULL);

	/* append data to buffer */
	ret_code = membuffer_append(&parser->msg.msg, buf, buf_length);
	if (ret_code != 0) {
		/* set failure status */
		parser->http_error_code = HTTP_INTERNAL_SERVER_ERROR;
		return PARSE_FAILURE;
	}

	return parser_parse(parser);
}